

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

basic_appender<char>
fmt::v11::detail::write<char,fmt::v11::basic_appender<char>>
          (basic_appender<char> out,basic_string_view<char> s,format_specs *specs)

{
  string_view s_00;
  string_view s_01;
  basic_string_view<char> str;
  presentation_type pVar1;
  make_unsigned_t<int> mVar2;
  char *s_02;
  basic_appender<char> bVar3;
  basic_specs *in_RCX;
  buffer<char> *in_RDX;
  char *in_RSI;
  size_t width;
  counting_buffer<char> buf;
  bool is_debug;
  size_t size;
  char *data;
  undefined1 in_stack_fffffffffffffe20;
  undefined7 in_stack_fffffffffffffe21;
  char *in_stack_fffffffffffffe38;
  size_t in_stack_fffffffffffffe40;
  basic_string_view<char> local_1b0;
  size_t in_stack_fffffffffffffe60;
  char *in_stack_fffffffffffffe68;
  size_t in_stack_fffffffffffffe70;
  basic_appender<char> local_180;
  buffer<char> local_178;
  anon_class_40_4_6b3cdfe0 *in_stack_fffffffffffffeb8;
  size_t in_stack_fffffffffffffec0;
  size_t in_stack_fffffffffffffec8;
  format_specs *in_stack_fffffffffffffed0;
  basic_appender<char> in_stack_fffffffffffffed8;
  size_t local_38;
  basic_string_view<char> local_20 [2];
  
  local_20[0].data_ = in_RSI;
  local_20[0].size_ = (size_t)in_RDX;
  s_02 = basic_string_view<char>::data(local_20);
  local_38 = basic_string_view<char>::size(local_20);
  if ((-1 < *(int *)in_RCX[1].fill_data_) && (mVar2 = to_unsigned<int>(0), mVar2 < local_38)) {
    to_unsigned<int>(0);
    s_01.size_ = in_stack_fffffffffffffe70;
    s_01.data_ = in_stack_fffffffffffffe68;
    local_38 = code_point_index(s_01,in_stack_fffffffffffffe60);
  }
  pVar1 = basic_specs::type(in_RCX);
  if (pVar1 == debug) {
    counting_buffer<char>::counting_buffer
              ((counting_buffer<char> *)
               CONCAT71(in_stack_fffffffffffffe21,in_stack_fffffffffffffe20));
    basic_appender<char>::basic_appender(&local_180,&local_178);
    str.size_ = (size_t)local_20[0].data_;
    str.data_ = in_stack_fffffffffffffe68;
    write_escaped_string<char,fmt::v11::basic_appender<char>>
              ((basic_appender<char>)local_20[0].size_,str);
    local_38 = counting_buffer<char>::count
                         ((counting_buffer<char> *)
                          CONCAT71(in_stack_fffffffffffffe21,in_stack_fffffffffffffe20));
  }
  if ((in_RCX[1].data_ != 0) && (pVar1 != debug)) {
    basic_string_view<char>::basic_string_view(&local_1b0,s_02,local_38);
    s_00.size_ = in_stack_fffffffffffffe40;
    s_00.data_ = in_stack_fffffffffffffe38;
    compute_width(s_00);
  }
  bVar3 = write_padded<char,(fmt::v11::align)1,fmt::v11::basic_appender<char>,fmt::v11::detail::write<char,fmt::v11::basic_appender<char>>(fmt::v11::basic_appender<char>,fmt::v11::basic_string_view<char>,fmt::v11::format_specs_const&)::_lambda(fmt::v11::basic_appender<char>)_1_>
                    (in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
                     in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  return (basic_appender<char>)bVar3.container;
}

Assistant:

FMT_CONSTEXPR auto write(OutputIt out, basic_string_view<Char> s,
                         const format_specs& specs) -> OutputIt {
  auto data = s.data();
  auto size = s.size();
  if (specs.precision >= 0 && to_unsigned(specs.precision) < size)
    size = code_point_index(s, to_unsigned(specs.precision));

  bool is_debug = specs.type() == presentation_type::debug;
  if (is_debug) {
    auto buf = counting_buffer<Char>();
    write_escaped_string(basic_appender<Char>(buf), s);
    size = buf.count();
  }

  size_t width = 0;
  if (specs.width != 0) {
    width =
        is_debug ? size : compute_width(basic_string_view<Char>(data, size));
  }
  return write_padded<Char>(
      out, specs, size, width, [=](reserve_iterator<OutputIt> it) {
        return is_debug ? write_escaped_string(it, s)
                        : copy<Char>(data, data + size, it);
      });
}